

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O2

int CfdClearWitnessStack(void *handle,void *create_handle,char *txid,uint32_t vout)

{
  ConfidentialTransaction *this;
  _func_int *p_Var1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  TransactionContext *tx;
  bool is_bitcoin;
  allocator local_69;
  Txid txid_obj;
  string local_48;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&txid_obj,"TransactionData",(allocator *)&local_48);
  cfd::capi::CheckBuffer(create_handle,(string *)&txid_obj);
  std::__cxx11::string::~string((string *)&txid_obj);
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    txid_obj._vptr_Txid = (_func_int **)0x4fe2f6;
    txid_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x2ba;
    txid_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdClearWitnessStack";
    cfd::core::logger::warn<>((CfdSourceLocation *)&txid_obj,"txid is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&txid_obj,"Failed to parameter. txid is null or empty.",
               (allocator *)&local_48);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&txid_obj);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_48,txid,(allocator *)&is_bitcoin);
  cfd::core::Txid::Txid(&txid_obj,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  this = *(ConfidentialTransaction **)((long)create_handle + 0x18);
  if (this != (ConfidentialTransaction *)0x0) {
    p_Var1 = (this->super_AbstractTransaction)._vptr_AbstractTransaction[2];
    if (is_bitcoin == true) {
      uVar3 = (*p_Var1)(this,&txid_obj,(ulong)vout);
      cfd::core::Transaction::RemoveScriptWitnessStackAll((Transaction *)this,uVar3);
    }
    else {
      uVar3 = (*p_Var1)(this,&txid_obj,(ulong)vout);
      cfd::core::ConfidentialTransaction::RemoveScriptWitnessStackAll(this,uVar3);
    }
    cfd::core::Txid::~Txid(&txid_obj);
    return 0;
  }
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_48,"Invalid handle state. tx is null",&local_69);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,&local_48);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdClearWitnessStack(
    void* handle, void* create_handle, const char* txid, uint32_t vout) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    Txid txid_obj(txid);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->RemoveScriptWitnessStackAll(index);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      auto index = tx->GetTxInIndex(txid_obj, vout);
      tx->RemoveScriptWitnessStackAll(index);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}